

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLUri::initialize(XMLUri *this,XMLUri *baseURI,XMLCh *uriSpec)

{
  short *psVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  XMLCh *pXVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar9;
  undefined4 extraout_var_08;
  XMLCh *toDelete;
  XMLCh *toDelete_00;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  MalformedURLException *pMVar10;
  long lVar11;
  XMLSize_t XVar12;
  ulong uVar13;
  size_t sVar14;
  ulong startIndex;
  ulong startIndex_00;
  ulong endIndex;
  ArrayJanitor<char16_t> tmp2Name;
  ArrayJanitor<char16_t> tmp1Name;
  ArrayJanitor<char16_t> pathName;
  ArrayJanitor<char16_t> basePathName;
  ArrayJanitor<char16_t> pathUriSpecName;
  ArrayJanitor<char16_t> authName;
  ArrayJanitor<char16_t> janName;
  ArrayJanitor<char16_t> local_a0;
  ArrayJanitor<char16_t> local_90;
  ArrayJanitor<char16_t> local_80;
  ArrayJanitor<char16_t> local_70;
  ArrayJanitor<char16_t> local_60;
  ArrayJanitor<char16_t> local_50;
  ArrayJanitor<char16_t> local_40;
  XMLCh *pXVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  
  if (uriSpec == (XMLCh *)0x0) {
    pXVar7 = (XMLCh *)0x0;
  }
  else {
    sVar14 = 0;
    do {
      psVar1 = (short *)((long)uriSpec + sVar14);
      sVar14 = sVar14 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
    pXVar7 = (XMLCh *)CONCAT44(extraout_var,iVar3);
    memcpy(pXVar7,uriSpec,sVar14);
  }
  XMLString::trim(pXVar7);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,pXVar7,this->fMemoryManager);
  endIndex = 0;
  if (pXVar7 != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)pXVar7 + endIndex);
      endIndex = endIndex + 2;
    } while (*psVar1 != 0);
    endIndex = ((long)endIndex >> 1) - 1;
  }
  if ((baseURI == (XMLUri *)0x0) && (pXVar7 == (XMLCh *)0x0 || endIndex == 0)) {
    pMVar10 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar10,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x191,XMLNUM_URI_Component_Empty,(XMLCh *)errMsg_PARAMS,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
    __cxa_throw(pMVar10,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  if ((pXVar7 == (XMLCh *)0x0) || (endIndex == 0)) {
    initialize(this,baseURI);
    goto LAB_0025a3fc;
  }
  iVar3 = XMLString::indexOf(pXVar7,L':');
  iVar4 = XMLString::indexOf(pXVar7,L'/');
  iVar5 = XMLString::indexOf(pXVar7,L'?');
  iVar6 = XMLString::indexOf(pXVar7,L'#');
  if ((((iVar3 < 1) || (iVar4 < iVar3 && iVar4 != -1)) || (iVar5 < iVar3 && iVar5 != -1)) ||
     (iVar6 != -1 && iVar6 < iVar3)) {
    if ((iVar3 == 0) || (baseURI == (XMLUri *)0x0 && iVar6 != 0)) {
      pMVar10 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar10,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                 ,0x1ac,XMLNUM_URI_No_Scheme,this->fMemoryManager);
      goto LAB_0025a4dd;
    }
    bVar2 = false;
    startIndex_00 = 0;
  }
  else {
    initializeScheme(this,pXVar7);
    bVar2 = true;
    if (this->fScheme == (XMLCh *)0x0) {
      startIndex_00 = 1;
    }
    else {
      lVar9 = 0;
      do {
        psVar1 = (short *)((long)this->fScheme + lVar9);
        lVar9 = lVar9 + 2;
      } while (*psVar1 != 0);
      startIndex_00 = lVar9 >> 1;
    }
  }
  if ((startIndex_00 == endIndex) || ((bVar2 && (pXVar7[startIndex_00] == L'#')))) {
    pMVar10 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar10,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x1bc,XMLNUM_URI_Component_Empty,(XMLCh *)errMsg_PATH,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
LAB_0025a4dd:
    __cxa_throw(pMVar10,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  lVar9 = endIndex * 2 + 2;
  iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar9);
  pXVar8 = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_50,pXVar8,this->fMemoryManager);
  XMLString::subString(pXVar8,pXVar7,startIndex_00,endIndex,this->fMemoryManager);
  if ((startIndex_00 + 1 < endIndex) &&
     (iVar3 = XMLString::compareNString(pXVar8,L"//",2), iVar3 == 0)) {
    startIndex = startIndex_00 + 2;
    startIndex_00 = startIndex;
    uVar13 = startIndex;
    if (startIndex < endIndex) {
      do {
        if (((ulong)(ushort)pXVar7[uVar13] < 0x40) &&
           (startIndex_00 = uVar13,
           (0x8000800800000000U >> ((ulong)(ushort)pXVar7[uVar13] & 0x3f) & 1) != 0)) break;
        uVar13 = uVar13 + 1;
        startIndex_00 = endIndex;
      } while (endIndex != uVar13);
    }
    if (startIndex < startIndex_00) {
      XMLString::subString(pXVar8,pXVar7,startIndex,startIndex_00,this->fMemoryManager);
      initializeAuthority(this,pXVar8);
    }
    else {
      setHost(this,L"");
    }
  }
  if (startIndex_00 < endIndex) {
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar9);
    pXVar8 = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
    ArrayJanitor<char16_t>::ArrayJanitor(&local_60,pXVar8,this->fMemoryManager);
    XMLString::subString(pXVar8,pXVar7,startIndex_00,endIndex,this->fMemoryManager);
    initializePath(this,pXVar8);
    if (baseURI != (XMLUri *)0x0) {
      if ((((this->fPath == (XMLCh *)0x0) || (*this->fPath == L'\0')) &&
          (this->fScheme == (XMLCh *)0x0)) &&
         ((this->fHost == (XMLCh *)0x0 && (this->fRegAuth == (XMLCh *)0x0)))) {
        pXVar7 = baseURI->fScheme;
        if (pXVar7 == (XMLCh *)0x0) {
          pXVar8 = (XMLCh *)0x0;
        }
        else {
          sVar14 = 0;
          do {
            psVar1 = (short *)((long)pXVar7 + sVar14);
            sVar14 = sVar14 + 2;
          } while (*psVar1 != 0);
          iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
          pXVar8 = (XMLCh *)CONCAT44(extraout_var_04,iVar3);
          memcpy(pXVar8,pXVar7,sVar14);
        }
        this->fScheme = pXVar8;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUserInfo);
        pXVar7 = baseURI->fUserInfo;
        if (pXVar7 == (XMLCh *)0x0) {
          pXVar8 = (XMLCh *)0x0;
        }
        else {
          sVar14 = 0;
          do {
            psVar1 = (short *)((long)pXVar7 + sVar14);
            sVar14 = sVar14 + 2;
          } while (*psVar1 != 0);
          iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
          pXVar8 = (XMLCh *)CONCAT44(extraout_var_12,iVar3);
          memcpy(pXVar8,pXVar7,sVar14);
        }
        this->fUserInfo = pXVar8;
        pXVar7 = baseURI->fHost;
        if (pXVar7 == (XMLCh *)0x0) {
          pXVar8 = (XMLCh *)0x0;
        }
        else {
          sVar14 = 0;
          do {
            psVar1 = (short *)((long)pXVar7 + sVar14);
            sVar14 = sVar14 + 2;
          } while (*psVar1 != 0);
          iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
          pXVar8 = (XMLCh *)CONCAT44(extraout_var_13,iVar3);
          memcpy(pXVar8,pXVar7,sVar14);
        }
        this->fHost = pXVar8;
        this->fPort = baseURI->fPort;
        pXVar7 = baseURI->fRegAuth;
        if (pXVar7 == (XMLCh *)0x0) {
          pXVar8 = (XMLCh *)0x0;
        }
        else {
          sVar14 = 0;
          do {
            psVar1 = (short *)((long)pXVar7 + sVar14);
            sVar14 = sVar14 + 2;
          } while (*psVar1 != 0);
          iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
          pXVar8 = (XMLCh *)CONCAT44(extraout_var_14,iVar3);
          memcpy(pXVar8,pXVar7,sVar14);
        }
        this->fRegAuth = pXVar8;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
        pXVar7 = baseURI->fPath;
        if (pXVar7 == (XMLCh *)0x0) {
          pXVar8 = (XMLCh *)0x0;
        }
        else {
          sVar14 = 0;
          do {
            psVar1 = (short *)((long)pXVar7 + sVar14);
            sVar14 = sVar14 + 2;
          } while (*psVar1 != 0);
          iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
          pXVar8 = (XMLCh *)CONCAT44(extraout_var_15,iVar3);
          memcpy(pXVar8,pXVar7,sVar14);
        }
        this->fPath = pXVar8;
        if (this->fQueryString == (XMLCh *)0x0) {
          pXVar7 = baseURI->fQueryString;
          if (pXVar7 == (XMLCh *)0x0) {
            pXVar8 = (XMLCh *)0x0;
          }
          else {
            sVar14 = 0;
            do {
              psVar1 = (short *)((long)pXVar7 + sVar14);
              sVar14 = sVar14 + 2;
            } while (*psVar1 != 0);
            iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
            pXVar8 = (XMLCh *)CONCAT44(extraout_var_16,iVar3);
            memcpy(pXVar8,pXVar7,sVar14);
          }
          this->fQueryString = pXVar8;
        }
      }
      else if (this->fScheme == (XMLCh *)0x0) {
        pXVar7 = baseURI->fScheme;
        if (pXVar7 == (XMLCh *)0x0) {
          pXVar8 = (XMLCh *)0x0;
        }
        else {
          sVar14 = 0;
          do {
            psVar1 = (short *)((long)pXVar7 + sVar14);
            sVar14 = sVar14 + 2;
          } while (*psVar1 != 0);
          iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
          pXVar8 = (XMLCh *)CONCAT44(extraout_var_02,iVar3);
          memcpy(pXVar8,pXVar7,sVar14);
        }
        this->fScheme = pXVar8;
        if ((this->fHost == (XMLCh *)0x0) && (this->fRegAuth == (XMLCh *)0x0)) {
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUserInfo);
          pXVar7 = baseURI->fUserInfo;
          if (pXVar7 == (XMLCh *)0x0) {
            pXVar8 = (XMLCh *)0x0;
          }
          else {
            sVar14 = 0;
            do {
              psVar1 = (short *)((long)pXVar7 + sVar14);
              sVar14 = sVar14 + 2;
            } while (*psVar1 != 0);
            iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
            pXVar8 = (XMLCh *)CONCAT44(extraout_var_03,iVar3);
            memcpy(pXVar8,pXVar7,sVar14);
          }
          this->fUserInfo = pXVar8;
          pXVar7 = baseURI->fHost;
          if (pXVar7 == (XMLCh *)0x0) {
            pXVar8 = (XMLCh *)0x0;
          }
          else {
            sVar14 = 0;
            do {
              psVar1 = (short *)((long)pXVar7 + sVar14);
              sVar14 = sVar14 + 2;
            } while (*psVar1 != 0);
            iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
            pXVar8 = (XMLCh *)CONCAT44(extraout_var_05,iVar3);
            memcpy(pXVar8,pXVar7,sVar14);
          }
          this->fHost = pXVar8;
          this->fPort = baseURI->fPort;
          pXVar7 = baseURI->fRegAuth;
          if (pXVar7 == (XMLCh *)0x0) {
            pXVar8 = (XMLCh *)0x0;
          }
          else {
            sVar14 = 0;
            do {
              psVar1 = (short *)((long)pXVar7 + sVar14);
              sVar14 = sVar14 + 2;
            } while (*psVar1 != 0);
            iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
            pXVar8 = (XMLCh *)CONCAT44(extraout_var_06,iVar3);
            memcpy(pXVar8,pXVar7,sVar14);
          }
          this->fRegAuth = pXVar8;
          pXVar7 = this->fPath;
          if (((pXVar7 == (XMLCh *)0x0) || (*pXVar7 == L'\0')) ||
             (iVar3 = XMLString::compareNString(pXVar7,L"/",1), iVar3 != 0)) {
            pXVar7 = baseURI->fPath;
            if (pXVar7 == (XMLCh *)0x0) {
              pXVar8 = (XMLCh *)0x0;
            }
            else {
              sVar14 = 0;
              do {
                psVar1 = (short *)((long)pXVar7 + sVar14);
                sVar14 = sVar14 + 2;
              } while (*psVar1 != 0);
              iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
              pXVar8 = (XMLCh *)CONCAT44(extraout_var_07,iVar3);
              memcpy(pXVar8,pXVar7,sVar14);
            }
            ArrayJanitor<char16_t>::ArrayJanitor(&local_70,pXVar8,this->fMemoryManager);
            lVar9 = 0;
            if (this->fPath != (XMLCh *)0x0) {
              do {
                psVar1 = (short *)((long)this->fPath + lVar9);
                lVar9 = lVar9 + 2;
              } while (*psVar1 != 0);
              lVar9 = (lVar9 >> 1) + -1;
            }
            lVar11 = 0;
            if (pXVar8 != (XMLCh *)0x0) {
              do {
                psVar1 = (short *)((long)pXVar8 + lVar11);
                lVar11 = lVar11 + 2;
              } while (*psVar1 != 0);
              lVar11 = (lVar11 >> 1) + -1;
            }
            lVar9 = (lVar9 + endIndex + lVar11) * 2 + 2;
            iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar9);
            pXVar7 = (XMLCh *)CONCAT44(extraout_var_08,iVar3);
            ArrayJanitor<char16_t>::ArrayJanitor(&local_80,pXVar7,this->fMemoryManager);
            *pXVar7 = L'\0';
            iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar9);
            toDelete = (XMLCh *)CONCAT44(extraout_var_09,iVar3);
            ArrayJanitor<char16_t>::ArrayJanitor(&local_90,toDelete,this->fMemoryManager);
            iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar9);
            toDelete_00 = (XMLCh *)CONCAT44(extraout_var_10,iVar3);
            ArrayJanitor<char16_t>::ArrayJanitor(&local_a0,toDelete_00,this->fMemoryManager);
            if (pXVar8 != (XMLCh *)0x0) {
              lVar9 = 0;
              do {
                psVar1 = (short *)((long)pXVar8 + lVar9);
                lVar9 = lVar9 + 2;
              } while (*psVar1 != 0);
              iVar3 = XMLString::lastIndexOf(L'/',pXVar8,(lVar9 >> 1) - 1);
              if (iVar3 != -1) {
                XMLString::subString(pXVar7,pXVar8,0,(long)(iVar3 + 1),this->fMemoryManager);
              }
            }
            XMLString::catString(pXVar7,this->fPath);
            while (iVar3 = XMLString::patternMatch(pXVar7,L"/./"), iVar3 != -1) {
              XMLString::subString(toDelete,pXVar7,0,(long)iVar3,this->fMemoryManager);
              XVar12 = 0;
              if (pXVar7 != (XMLCh *)0x0) {
                do {
                  psVar1 = (short *)((long)pXVar7 + XVar12);
                  XVar12 = XVar12 + 2;
                } while (*psVar1 != 0);
                XVar12 = ((long)XVar12 >> 1) - 1;
              }
              XMLString::subString(toDelete_00,pXVar7,(long)(iVar3 + 2),XVar12,this->fMemoryManager)
              ;
              *pXVar7 = L'\0';
              XMLString::catString(pXVar7,toDelete);
              XMLString::catString(pXVar7,toDelete_00);
            }
            bVar2 = XMLString::endsWith(pXVar7,L"/.");
            if (bVar2) {
              lVar9 = 0;
              if (pXVar7 != (XMLCh *)0x0) {
                do {
                  psVar1 = (short *)((long)pXVar7 + lVar9);
                  lVar9 = lVar9 + 2;
                } while (*psVar1 != 0);
                lVar9 = (lVar9 >> 1) + -1;
              }
              pXVar7[lVar9 + -1] = L'\0';
            }
            iVar3 = 1;
LAB_0025a05d:
            do {
              iVar4 = XMLString::patternMatch(pXVar7 + iVar3,(XMLCh *)SLASH_DOTDOT_SLASH);
              if (iVar4 == -1) goto LAB_0025a168;
              XMLString::subString
                        (toDelete,pXVar7,0,(long)(iVar4 + -1 + iVar3),this->fMemoryManager);
              XVar12 = 0;
              if (toDelete != (XMLCh *)0x0) {
                do {
                  psVar1 = (short *)((long)toDelete + XVar12);
                  XVar12 = XVar12 + 2;
                } while (*psVar1 != 0);
                XVar12 = ((long)XVar12 >> 1) - 1;
              }
              iVar5 = XMLString::lastIndexOf(L'/',toDelete,XVar12);
              if (iVar5 != -1) {
                XVar12 = (XMLSize_t)iVar5;
                if (((pXVar7[XVar12 + 1] != L'.') || (pXVar7[XVar12 + 2] != L'.')) ||
                   (iVar5 + 3 != iVar4 + iVar3)) {
                  XMLString::subString(toDelete,pXVar7,0,XVar12,this->fMemoryManager);
                  XVar12 = 0;
                  if (pXVar7 != (XMLCh *)0x0) {
                    do {
                      psVar1 = (short *)((long)pXVar7 + XVar12);
                      XVar12 = XVar12 + 2;
                    } while (*psVar1 != 0);
                    XVar12 = ((long)XVar12 >> 1) - 1;
                  }
                  XMLString::subString
                            (toDelete_00,pXVar7,(long)(iVar4 + iVar3 + 3),XVar12,
                             this->fMemoryManager);
                  *pXVar7 = L'\0';
                  XMLString::catString(pXVar7,toDelete);
                  XMLString::catString(pXVar7,toDelete_00);
                  iVar3 = iVar5 + (uint)(iVar5 == 0);
                  goto LAB_0025a05d;
                }
              }
              iVar3 = iVar3 + 4;
            } while( true );
          }
        }
      }
    }
    goto LAB_0025a3e8;
  }
LAB_0025a3f2:
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_50);
LAB_0025a3fc:
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return;
LAB_0025a168:
  bVar2 = XMLString::endsWith(pXVar7,L"/..");
  if (bVar2) {
    lVar9 = 0;
    if (pXVar7 != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)pXVar7 + lVar9);
        lVar9 = lVar9 + 2;
      } while (*psVar1 != 0);
      lVar9 = (lVar9 >> 1) + -1;
    }
    XMLString::subString(toDelete,pXVar7,0,lVar9 - 4,this->fMemoryManager);
    iVar3 = XMLString::lastIndexOf(toDelete,L'/');
    if ((iVar3 != -1) &&
       (((pXVar7[(long)iVar3 + 1] != L'.' || (iVar3 != (int)lVar9 + -6)) ||
        (pXVar7[(long)iVar3 + 2] != L'.')))) {
      pXVar7[(long)iVar3 + 1] = L'\0';
    }
  }
  if (this->fPath != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
  }
  if (pXVar7 == (XMLCh *)0x0) {
    pXVar8 = (XMLCh *)0x0;
  }
  else {
    sVar14 = 0;
    do {
      psVar1 = (short *)((long)pXVar7 + sVar14);
      sVar14 = sVar14 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar14);
    pXVar8 = (XMLCh *)CONCAT44(extraout_var_11,iVar3);
    memcpy(pXVar8,pXVar7,sVar14);
  }
  this->fPath = pXVar8;
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_a0);
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_90);
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_80);
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_70);
LAB_0025a3e8:
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_60);
  goto LAB_0025a3f2;
}

Assistant:

void XMLUri::initialize(const XMLUri* const baseURI
                      , const XMLCh*  const uriSpec)
{

    // get a trimmed version of uriSpec
    // uriSpec will NO LONGER be used in this function.
    //
    XMLCh* trimmedUriSpec = XMLString::replicate(uriSpec, fMemoryManager);
    XMLString::trim(trimmedUriSpec);
    ArrayJanitor<XMLCh> janName(trimmedUriSpec, fMemoryManager);
    XMLSize_t trimmedUriSpecLen = XMLString::stringLen(trimmedUriSpec);

    if ( !baseURI &&
        (!trimmedUriSpec || trimmedUriSpecLen == 0))
    {
        ThrowXMLwithMemMgr1(MalformedURLException
               , XMLExcepts::XMLNUM_URI_Component_Empty
               , errMsg_PARAMS
               , fMemoryManager);
    }

	// just make a copy of the base if spec is empty
	if (!trimmedUriSpec || trimmedUriSpecLen == 0)
    {
        initialize(*baseURI);
        return;
	}

	XMLSize_t index = 0;
	bool foundScheme = false;

	// Check for scheme, which must be before `/', '?' or '#'.
        int colonIdx = XMLString::indexOf(trimmedUriSpec, chColon);
        int slashIdx = XMLString::indexOf(trimmedUriSpec, chForwardSlash);
        int queryIdx = XMLString::indexOf(trimmedUriSpec, chQuestion);
        int fragmentIdx = XMLString::indexOf(trimmedUriSpec, chPound);

        if ((colonIdx <= 0) ||
            (colonIdx > slashIdx && slashIdx != -1) ||
            (colonIdx > queryIdx && queryIdx != -1) ||
            (colonIdx > fragmentIdx && fragmentIdx != -1))
        {
            // A standalone base is a valid URI according to spec
            if ( colonIdx == 0 || (!baseURI && fragmentIdx != 0) )
            {
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::XMLNUM_URI_No_Scheme, fMemoryManager);
            }
        }
        else
        {
            foundScheme = true;
            initializeScheme(trimmedUriSpec);
            index = XMLString::stringLen(fScheme)+1;
        }

    // It's an error if we stop here
    if (index == trimmedUriSpecLen || (foundScheme && (trimmedUriSpec[index] == chPound)))
    {
        ThrowXMLwithMemMgr1(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Empty
                , errMsg_PATH
                , fMemoryManager);
    }

	// two slashes means generic URI syntax, so we get the authority
    XMLCh* authUriSpec = (XMLCh*) fMemoryManager->allocate
    (
        (trimmedUriSpecLen+1) * sizeof(XMLCh)
    );//new XMLCh[trimmedUriSpecLen+1];
    ArrayJanitor<XMLCh> authName(authUriSpec, fMemoryManager);
    XMLString::subString(authUriSpec, trimmedUriSpec, index, trimmedUriSpecLen, fMemoryManager);

    if (((index+1) < trimmedUriSpecLen) &&
        XMLString::startsWith(authUriSpec, DOUBLE_SLASH))
    {
        index += 2;
        XMLSize_t startPos = index;

        // get authority - everything up to path, query or fragment
        XMLCh testChar;
        while (index < trimmedUriSpecLen)
        {
            testChar = trimmedUriSpec[index];
            if (testChar == chForwardSlash ||
                testChar == chQuestion     ||
                testChar == chPound         )
            {
                break;
            }

            index++;
        }

        // if we found authority, parse it out, otherwise we set the
        // host to empty string
        if (index > startPos)
        {
            XMLString::subString(authUriSpec, trimmedUriSpec, startPos, index, fMemoryManager);
            initializeAuthority(authUriSpec);
        }
        else
        {
            //fHost = 0;
            setHost(XMLUni::fgZeroLenString);
        }
    }

    // we need to check if index has exceed the lenght or not
    if (index >= trimmedUriSpecLen)
        return;

    XMLCh* pathUriSpec = (XMLCh*) fMemoryManager->allocate
    (
        (trimmedUriSpecLen+1) * sizeof(XMLCh)
    );//new XMLCh[trimmedUriSpecLen+1];
    ArrayJanitor<XMLCh> pathUriSpecName(pathUriSpec, fMemoryManager);
    XMLString::subString(pathUriSpec, trimmedUriSpec, index, trimmedUriSpecLen, fMemoryManager);

	initializePath(pathUriSpec);

	// Resolve relative URI to base URI - see RFC 2396 Section 5.2
	// In some cases, it might make more sense to throw an exception
	// (when scheme is specified is the string spec and the base URI
	// is also specified, for example), but we're just following the
	// RFC specifications
	if ( baseURI )
    {
        // check to see if this is the current doc - RFC 2396 5.2 #2
        // note that this is slightly different from the RFC spec in that
        // we don't include the check for query string being null
        // - this handles cases where the urispec is just a query
        // string or a fragment (e.g. "?y" or "#s") -
        // see <http://www.ics.uci.edu/~fielding/url/test1.html> which
        // identified this as a bug in the RFC
        if ((!fPath || !*fPath) &&
            fScheme == 0 &&
            fHost == 0 && fRegAuth == 0)
        {
            fScheme = XMLString::replicate(baseURI->getScheme(), fMemoryManager);
            fMemoryManager->deallocate(fUserInfo);//delete [] fUserInfo;
            fUserInfo = XMLString::replicate(baseURI->getUserInfo(), fMemoryManager);
            fHost = XMLString::replicate(baseURI->getHost(), fMemoryManager);
            fPort = baseURI->getPort();
            fRegAuth = XMLString::replicate(baseURI->getRegBasedAuthority(), fMemoryManager);
            fMemoryManager->deallocate(fPath);//delete [] fPath;
            fPath = XMLString::replicate(baseURI->getPath(), fMemoryManager);

            if ( !fQueryString )
            {
                fQueryString = XMLString::replicate(baseURI->getQueryString(), fMemoryManager);
            }
            return;
        }

        // check for scheme - RFC 2396 5.2 #3
        // if we found a scheme, it means absolute URI, so we're done
        if (fScheme == 0)
        {
            fScheme = XMLString::replicate(baseURI->getScheme(), fMemoryManager);
        }
        else
        {
            return;
        }

        // check for authority - RFC 2396 5.2 #4
        // if we found a host, then we've got a network path, so we're done
        if (fHost == 0 && fRegAuth == 0)
        {
            fMemoryManager->deallocate(fUserInfo);//delete [] fUserInfo;
            fUserInfo = XMLString::replicate(baseURI->getUserInfo(), fMemoryManager);
            fHost = XMLString::replicate(baseURI->getHost(), fMemoryManager);
            fPort = baseURI->getPort();
            fRegAuth = XMLString::replicate(baseURI->getRegBasedAuthority(), fMemoryManager);
        }
        else
        {
            return;
        }

        // check for absolute path - RFC 2396 5.2 #5
        if ((fPath && *fPath) &&
            XMLString::startsWith(fPath, SINGLE_SLASH))
        {
            return;
        }

        // if we get to this point, we need to resolve relative path
        // RFC 2396 5.2 #6

        XMLCh* basePath = XMLString::replicate(baseURI->getPath(), fMemoryManager);
        ArrayJanitor<XMLCh> basePathName(basePath, fMemoryManager);

        XMLSize_t bufLen = trimmedUriSpecLen+XMLString::stringLen(fPath)+XMLString::stringLen(basePath)+1;
        XMLCh* path = (XMLCh*) fMemoryManager->allocate(bufLen * sizeof(XMLCh));//new XMLCh[bufLen];
        ArrayJanitor<XMLCh> pathName(path, fMemoryManager);
        path[0] = 0;

        XMLCh* tmp1 = (XMLCh*) fMemoryManager->allocate(bufLen * sizeof(XMLCh));//new XMLCh[bufLen];
        ArrayJanitor<XMLCh> tmp1Name(tmp1, fMemoryManager);
        XMLCh* tmp2 = (XMLCh*) fMemoryManager->allocate(bufLen * sizeof(XMLCh));//new XMLCh[bufLen];
        ArrayJanitor<XMLCh> tmp2Name(tmp2, fMemoryManager);

        // 6a - get all but the last segment of the base URI path
        if (basePath)
        {
            int lastSlash = XMLString::lastIndexOf(basePath, chForwardSlash);
            if (lastSlash != -1)
            {
                XMLString::subString(path, basePath, 0, lastSlash+1, fMemoryManager);
            }
        }

        // 6b - append the relative URI path
        XMLString::catString(path, fPath);

        // 6c - remove all "./" where "." is a complete path segment
        int iIndex = -1;
        while ((iIndex = XMLString::patternMatch(path, SLASH_DOT_SLASH)) != -1)
        {
            XMLString::subString(tmp1, path, 0, iIndex, fMemoryManager);
            XMLString::subString(tmp2, path, iIndex+2, XMLString::stringLen(path), fMemoryManager);

            path[0] = 0;
            XMLString::catString(path, tmp1);
            XMLString::catString(path, tmp2);
        }

        // 6d - remove "." if path ends with "." as a complete path segment
        if (XMLString::endsWith(path, SLASH_DOT))
        {
            path[XMLString::stringLen(path) - 1] = chNull;
        }

        // 6e - remove all "<segment>/../" where "<segment>" is a complete
        // path segment not equal to ".."
        iIndex = -1;
        int segIndex = -1;
        int offset = 1;

        while ((iIndex = XMLString::patternMatch(&(path[offset]), SLASH_DOTDOT_SLASH)) != -1)
        {
			// Undo offset
			iIndex += offset;

			// Find start of <segment> within substring ending at found point.
			XMLString::subString(tmp1, path, 0, iIndex-1, fMemoryManager);
			segIndex = XMLString::lastIndexOf(tmp1, chForwardSlash);

			// Ensure <segment> exists and != ".."
            if (segIndex != -1                &&
                (path[segIndex+1] != chPeriod ||
                 path[segIndex+2] != chPeriod ||
				 segIndex + 3 != iIndex))
            {

                XMLString::subString(tmp1, path, 0, segIndex, fMemoryManager);
                XMLString::subString(tmp2, path, iIndex+3, XMLString::stringLen(path), fMemoryManager);

                path[0] = 0;
                XMLString::catString(path, tmp1);
                XMLString::catString(path, tmp2);

                offset = (segIndex == 0 ? 1 : segIndex);
            }
            else
            {
                offset += 4;
            }
        }// while

        // 6f - remove ending "<segment>/.." where "<segment>" is a
        // complete path segment
        if (XMLString::endsWith(path, SLASH_DOTDOT))
        {
			// Find start of <segment> within substring ending at found point.
            index = XMLString::stringLen(path) - 3;
			XMLString::subString(tmp1, path, 0, index-1, fMemoryManager);
			segIndex = XMLString::lastIndexOf(tmp1, chForwardSlash);

            if (segIndex != -1                &&
                (path[segIndex+1] != chPeriod ||
                 path[segIndex+2] != chPeriod ||
				 segIndex + 3 != (int)index))
            {
                path[segIndex+1] = chNull;
            }
        }

        if (getPath())
            fMemoryManager->deallocate(fPath);//delete [] fPath;

        fPath = XMLString::replicate(path, fMemoryManager);

    }
}